

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::GenerateFrameworkInfoPList
          (cmLocalGenerator *this,cmGeneratorTarget *target,string *targetName,string *fname)

{
  cmMakefile *this_00;
  bool bVar1;
  cmValue cVar2;
  ostream *poVar3;
  string *psVar4;
  string_view value;
  allocator<char> local_1e5;
  cmNewLineStyle local_1e4;
  string inFile;
  ScopePushPop varScope;
  string inMod;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&inMod,"MACOSX_FRAMEWORK_INFO_PLIST",(allocator<char> *)&inFile);
  cVar2 = cmGeneratorTarget::GetProperty(target,&inMod);
  std::__cxx11::string::~string((string *)&inMod);
  if ((cVar2.Value == (string *)0x0) || ((cVar2.Value)->_M_string_length == 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&inFile,"MacOSXFrameworkInfo.plist.in",(allocator<char> *)&inMod);
  }
  else {
    std::__cxx11::string::string((string *)&inFile,(string *)cVar2.Value);
  }
  bVar1 = cmsys::SystemTools::FileIsFullPath(&inFile);
  if (!bVar1) {
    cmMakefile::GetModulesFile(&inMod,this->Makefile,&inFile);
    if (inMod._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&inFile);
    }
    std::__cxx11::string::~string((string *)&inMod);
  }
  bVar1 = cmsys::SystemTools::FileExists(&inFile,true);
  if (bVar1) {
    this_00 = this->Makefile;
    varScope.Makefile = this_00;
    cmMakefile::PushScope(this_00);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&inMod,"MACOSX_FRAMEWORK_NAME",&local_1e5);
    value._M_str = (targetName->_M_dataplus)._M_p;
    value._M_len = targetName->_M_string_length;
    cmMakefile::AddDefinition(this_00,&inMod,value);
    std::__cxx11::string::~string((string *)&inMod);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&inMod,"MACOSX_FRAMEWORK_ICON_FILE",&local_1e5);
    cmLGInfoProp(this_00,target,&inMod);
    std::__cxx11::string::~string((string *)&inMod);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&inMod,"MACOSX_FRAMEWORK_IDENTIFIER",&local_1e5);
    cmLGInfoProp(this_00,target,&inMod);
    std::__cxx11::string::~string((string *)&inMod);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&inMod,"MACOSX_FRAMEWORK_SHORT_VERSION_STRING",&local_1e5);
    cmLGInfoProp(this_00,target,&inMod);
    std::__cxx11::string::~string((string *)&inMod);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&inMod,"MACOSX_FRAMEWORK_BUNDLE_VERSION",&local_1e5);
    cmLGInfoProp(this_00,target,&inMod);
    std::__cxx11::string::~string((string *)&inMod);
    cmNewLineStyle::cmNewLineStyle(&local_1e4);
    cmMakefile::ConfigureFile(this_00,&inFile,fname,false,false,false,0,local_1e4);
    cmMakefile::ScopePushPop::~ScopePushPop(&varScope);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&inMod);
    poVar3 = std::operator<<((ostream *)&inMod,"Target ");
    psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    poVar3 = std::operator<<(poVar3,(string *)psVar4);
    poVar3 = std::operator<<(poVar3," Info.plist template \"");
    poVar3 = std::operator<<(poVar3,(string *)&inFile);
    std::operator<<(poVar3,"\" could not be found.");
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error((string *)&varScope);
    std::__cxx11::string::~string((string *)&varScope);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&inMod);
  }
  std::__cxx11::string::~string((string *)&inFile);
  return;
}

Assistant:

void cmLocalGenerator::GenerateFrameworkInfoPList(
  cmGeneratorTarget* target, const std::string& targetName,
  const std::string& fname)
{
  // Find the Info.plist template.
  cmValue in = target->GetProperty("MACOSX_FRAMEWORK_INFO_PLIST");
  std::string inFile = cmNonempty(in) ? *in : "MacOSXFrameworkInfo.plist.in";
  if (!cmSystemTools::FileIsFullPath(inFile)) {
    std::string inMod = this->Makefile->GetModulesFile(inFile);
    if (!inMod.empty()) {
      inFile = inMod;
    }
  }
  if (!cmSystemTools::FileExists(inFile, true)) {
    std::ostringstream e;
    e << "Target " << target->GetName() << " Info.plist template \"" << inFile
      << "\" could not be found.";
    cmSystemTools::Error(e.str());
    return;
  }

  // Convert target properties to variables in an isolated makefile
  // scope to configure the file.  If properties are set they will
  // override user make variables.  If not the configuration will fall
  // back to the directory-level values set by the user.
  cmMakefile* mf = this->Makefile;
  cmMakefile::ScopePushPop varScope(mf);
  mf->AddDefinition("MACOSX_FRAMEWORK_NAME", targetName);
  cmLGInfoProp(mf, target, "MACOSX_FRAMEWORK_ICON_FILE");
  cmLGInfoProp(mf, target, "MACOSX_FRAMEWORK_IDENTIFIER");
  cmLGInfoProp(mf, target, "MACOSX_FRAMEWORK_SHORT_VERSION_STRING");
  cmLGInfoProp(mf, target, "MACOSX_FRAMEWORK_BUNDLE_VERSION");
  mf->ConfigureFile(inFile, fname, false, false, false);
}